

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void init_functions(void)

{
  DFsScript *this;
  int iVar1;
  PClassActor *pPVar2;
  DFsVariable *pDVar3;
  FLineSpecial *pFVar4;
  PClassActor **ppPVar5;
  int special;
  long lVar6;
  
  ppPVar5 = ActorTypes;
  lVar6 = 0;
  do {
    pPVar2 = PClass::FindActor((char *)((long)&_ZL15ActorNames_init_rel +
                                       (long)*(int *)((long)&_ZL15ActorNames_init_rel + lVar6)));
    *ppPVar5 = pPVar2;
    this = global_script;
    lVar6 = lVar6 + 4;
    ppPVar5 = ppPVar5 + 1;
  } while (lVar6 != 0x22c);
  pDVar3 = DFsScript::NewVariable(global_script,"consoleplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"displayplayer",7);
  (pDVar3->value).pI = &consoleplayer;
  pDVar3 = DFsScript::NewVariable(this,"zoom",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"fov",7);
  (pDVar3->value).pI = &zoom;
  pDVar3 = DFsScript::NewVariable(this,"trigger",8);
  (pDVar3->value).pI = (int *)&trigger_obj;
  iVar1 = P_GetMaxLineSpecial();
  if (-1 < iVar1) {
    special = 0;
    do {
      pFVar4 = P_GetLineSpecialInfo(special);
      if ((pFVar4 != (FLineSpecial *)0x0) && (-1 < pFVar4->max_args)) {
        pDVar3 = DFsScript::NewVariable(this,pFVar4->name,9);
        (pDVar3->value).ls = pFVar4;
      }
      special = special + 1;
    } while (iVar1 + 1 != special);
  }
  DFsScript::NewFunction(this,"break",0x67eef6);
  DFsScript::NewFunction(this,"continue",0x67eec4);
  DFsScript::NewFunction(this,"return",0x67ef7c);
  DFsScript::NewFunction(this,"goto",0x67ef2c);
  DFsScript::NewFunction(this,"include",0x67ef9e);
  DFsScript::NewFunction(this,"print",0x67edc4);
  DFsScript::NewFunction(this,"rnd",0x67ee16);
  DFsScript::NewFunction(this,"prnd",0x67ee16);
  DFsScript::NewFunction(this,"input",0x67f02a);
  DFsScript::NewFunction(this,"beep",0x67f03e);
  DFsScript::NewFunction(this,"clock",0x67f06c);
  DFsScript::NewFunction(this,"wait",0x6853b6);
  DFsScript::NewFunction(this,"tagwait",0x68542e);
  DFsScript::NewFunction(this,"scriptwait",0x68548c);
  DFsScript::NewFunction(this,"startscript",0x685548);
  DFsScript::NewFunction(this,"scriptrunning",0x6856a6);
  DFsScript::NewFunction(this,"startskill",0x681b4a);
  DFsScript::NewFunction(this,"exitlevel",0x67f0a0);
  DFsScript::NewFunction(this,"tip",0x67f0aa);
  DFsScript::NewFunction(this,"timedtip",0x67f156);
  DFsScript::NewFunction(this,"message",0x67f36e);
  DFsScript::NewFunction(this,"gameskill",0x6823ec);
  DFsScript::NewFunction(this,"gamemode",0x68240e);
  DFsScript::NewFunction(this,"playermsg",0x67f40e);
  DFsScript::NewFunction(this,"playertip",0x67f244);
  DFsScript::NewFunction(this,"playeringame",0x67f4be);
  DFsScript::NewFunction(this,"playername",0x67f512);
  DFsScript::NewFunction(this,"playeraddfrag",0x683efc);
  DFsScript::NewFunction(this,"playerobj",0x67f5f4);
  DFsScript::NewFunction(this,"isplayerobj",0x682452);
  DFsScript::NewFunction(this,"isobjplayer",0x682452);
  DFsScript::NewFunction(this,"skincolor",0x683fba);
  DFsScript::NewFunction(this,"playerkeys",0x6824b8);
  DFsScript::NewFunction(this,"playerammo",0x68275a);
  DFsScript::NewFunction(this,"maxplayerammo",0x682904);
  DFsScript::NewFunction(this,"playerweapon",0x682b4c);
  DFsScript::NewFunction(this,"playerselwep",0x682cee);
  DFsScript::NewFunction(this,"spawn",0x67f71e);
  DFsScript::NewFunction(this,"spawnexplosion",0x6835d0);
  DFsScript::NewFunction(this,"radiusattack",0x683764);
  DFsScript::NewFunction(this,"kill",0x67f974);
  DFsScript::NewFunction(this,"removeobj",0x67f92c);
  DFsScript::NewFunction(this,"objx",0x67f9fe);
  DFsScript::NewFunction(this,"objy",0x67fa6c);
  DFsScript::NewFunction(this,"objz",0x67fada);
  DFsScript::NewFunction(this,"testlocation",0x6838da);
  DFsScript::NewFunction(this,"teleport",0x67fbb8);
  DFsScript::NewFunction(this,"silentteleport",0x67fc66);
  DFsScript::NewFunction(this,"damageobj",0x67fd14);
  DFsScript::NewFunction(this,"healobj",0x68393e);
  DFsScript::NewFunction(this,"player",0x67f6a4);
  DFsScript::NewFunction(this,"objsector",0x67fdfa);
  DFsScript::NewFunction(this,"objflag",0x67fecc);
  DFsScript::NewFunction(this,"pushobj",0x68000a);
  DFsScript::NewFunction(this,"pushthing",0x68000a);
  DFsScript::NewFunction(this,"objangle",0x67fb48);
  DFsScript::NewFunction(this,"objhealth",0x67fe6a);
  DFsScript::NewFunction(this,"objdead",0x683a2e);
  DFsScript::NewFunction(this,"reactiontime",0x680092);
  DFsScript::NewFunction(this,"objreactiontime",0x680092);
  DFsScript::NewFunction(this,"objtarget",0x680134);
  DFsScript::NewFunction(this,"objmomx",0x6801f6);
  DFsScript::NewFunction(this,"objmomy",0x68028e);
  DFsScript::NewFunction(this,"objmomz",0x680326);
  DFsScript::NewFunction(this,"spawnmissile",0x683aa0);
  DFsScript::NewFunction(this,"mapthings",0x683ce6);
  DFsScript::NewFunction(this,"objtype",0x684188);
  DFsScript::NewFunction(this,"mapthingnumexist",0x683b64);
  DFsScript::NewFunction(this,"objstate",0x683d04);
  DFsScript::NewFunction(this,"resurrect",0x683fc0);
  DFsScript::NewFunction(this,"lineattack",0x68408e);
  DFsScript::NewFunction(this,"setobjposition",0x683806);
  DFsScript::NewFunction(this,"floorheight",0x6809fc);
  DFsScript::NewFunction(this,"floortext",0x6816e4);
  DFsScript::NewFunction(this,"floortexture",0x6816e4);
  DFsScript::NewFunction(this,"movefloor",0x680cca);
  DFsScript::NewFunction(this,"ceilheight",0x680e2e);
  DFsScript::NewFunction(this,"ceilingheight",0x680e2e);
  DFsScript::NewFunction(this,"moveceil",0x6810fc);
  DFsScript::NewFunction(this,"moveceiling",0x6810fc);
  DFsScript::NewFunction(this,"ceilingtexture",0x681916);
  DFsScript::NewFunction(this,"ceiltext",0x681916);
  DFsScript::NewFunction(this,"lightlevel",0x6812a2);
  DFsScript::NewFunction(this,"fadelight",0x681588);
  DFsScript::NewFunction(this,"colormap",0x681914);
  DFsScript::NewFunction(this,"setcamera",0x68056e);
  DFsScript::NewFunction(this,"clearcamera",0x680728);
  DFsScript::NewFunction(this,"movecamera",0x683188);
  DFsScript::NewFunction(this,"pointtoangle",0x6803be);
  DFsScript::NewFunction(this,"pointtodist",0x6804a4);
  DFsScript::NewFunction(this,"startsound",0x680796);
  DFsScript::NewFunction(this,"startsectorsound",0x6808ec);
  DFsScript::NewFunction(this,"ambientsound",0x683446);
  DFsScript::NewFunction(this,"startambiantsound",0x683446);
  DFsScript::NewFunction(this,"changemusic",0x681f12);
  DFsScript::NewFunction(this,"changehublevel",0x681b3c);
  DFsScript::NewFunction(this,"opendoor",0x681b58);
  DFsScript::NewFunction(this,"closedoor",0x681c52);
  DFsScript::NewFunction(this,"newhupic",0x684612);
  DFsScript::NewFunction(this,"createpic",0x684612);
  DFsScript::NewFunction(this,"deletehupic",0x6846a6);
  DFsScript::NewFunction(this,"modifyhupic",0x684700);
  DFsScript::NewFunction(this,"modifypic",0x684700);
  DFsScript::NewFunction(this,"sethupicdisplay",0x6847ca);
  DFsScript::NewFunction(this,"setpicvisible",0x6847ca);
  DFsScript::NewFunction(this,"playdemo",0x683fbc);
  DFsScript::NewFunction(this,"runcommand",0x681cee);
  DFsScript::NewFunction(this,"checkcvar",0x683fbe);
  DFsScript::NewFunction(this,"setlinetexture",0x6820c8);
  DFsScript::NewFunction(this,"linetrigger",0x681d3a);
  DFsScript::NewFunction(this,"lineflag",0x683dfa);
  DFsScript::NewFunction(this,"max",0x6822dc);
  DFsScript::NewFunction(this,"min",0x682340);
  DFsScript::NewFunction(this,"abs",0x6823a4);
  DFsScript::NewFunction(this,"sin",0x684234);
  DFsScript::NewFunction(this,"asin",0x6842a2);
  DFsScript::NewFunction(this,"cos",0x6842f4);
  DFsScript::NewFunction(this,"acos",0x684362);
  DFsScript::NewFunction(this,"tan",0x6843b4);
  DFsScript::NewFunction(this,"atan",0x684406);
  DFsScript::NewFunction(this,"exp",0x684458);
  DFsScript::NewFunction(this,"log",0x6844aa);
  DFsScript::NewFunction(this,"sqrt",0x6844fc);
  DFsScript::NewFunction(this,"floor",0x68454e);
  DFsScript::NewFunction(this,"pow",0x684594);
  DFsScript::NewFunction(this,"setlineblocking",0x681f46);
  DFsScript::NewFunction(this,"setlinetrigger",0x685104);
  DFsScript::NewFunction(this,"setlinemnblock",0x68200c);
  DFsScript::NewFunction(this,"scriptwaitpre",0x6854ea);
  DFsScript::NewFunction(this,"exitsecret",0x6834a0);
  DFsScript::NewFunction(this,"objawaken",0x6833ca);
  DFsScript::NewFunction(this,"mobjvalue",0x6834a8);
  DFsScript::NewFunction(this,"stringvalue",0x6834ea);
  DFsScript::NewFunction(this,"intvalue",0x68354c);
  DFsScript::NewFunction(this,"fixedvalue",0x68358e);
  DFsScript::NewFunction(this,"spawnshot2",0x684e4c);
  DFsScript::NewFunction(this,"setcolor",0x684c52);
  DFsScript::NewFunction(this,"objradius",0x6848c2);
  DFsScript::NewFunction(this,"objheight",0x68495a);
  DFsScript::NewFunction(this,"thingcount",0x6849f2);
  DFsScript::NewFunction(this,"killinsector",0x685008);
  DFsScript::NewFunction(this,"levelnum",0x6848a6);
  DFsScript::NewFunction(this,"giveinventory",0x682e62);
  DFsScript::NewFunction(this,"takeinventory",0x682f0a);
  DFsScript::NewFunction(this,"checkinventory",0x682fb2);
  DFsScript::NewFunction(this,"setweapon",0x683042);
  DFsScript::NewFunction(this,"setcorona",0x684848);
  return;
}

Assistant:

void init_functions(void)
{
	for(unsigned i=0;i<countof(ActorNames_init);i++)
	{
		ActorTypes[i]=PClass::FindActor(ActorNames_init[i]);
	}

	DFsScript * gscr = global_script;

	// add all the functions
	gscr->NewVariable("consoleplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("displayplayer", svt_pInt)->value.pI = &consoleplayer;
	gscr->NewVariable("zoom", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("fov", svt_pInt)->value.pI = &zoom;
	gscr->NewVariable("trigger", svt_pMobj)->value.pMobj = &trigger_obj;

	// Create constants for all existing line specials
	int max = P_GetMaxLineSpecial();
	for(int i=0; i<=max; i++)
	{
		const FLineSpecial *ls = P_GetLineSpecialInfo(i);

		if (ls != NULL && ls->max_args >= 0)	// specials with max args set to -1 can only be used in a map and are of no use hee.
		{
			gscr->NewVariable(ls->name, svt_linespec)->value.ls = ls;
		}
	}
	
	// important C-emulating stuff
	gscr->NewFunction("break", &FParser::SF_Break);
	gscr->NewFunction("continue", &FParser::SF_Continue);
	gscr->NewFunction("return", &FParser::SF_Return);
	gscr->NewFunction("goto", &FParser::SF_Goto);
	gscr->NewFunction("include", &FParser::SF_Include);
	
	// standard FraggleScript functions
	gscr->NewFunction("print", &FParser::SF_Print);
	gscr->NewFunction("rnd", &FParser::SF_Rnd);	// Legacy uses a normal rand() call for this which is extremely dangerous.
	gscr->NewFunction("prnd", &FParser::SF_Rnd);	// I am mapping rnd and prnd to the same named RNG which should eliminate any problem
	gscr->NewFunction("input", &FParser::SF_Input);
	gscr->NewFunction("beep", &FParser::SF_Beep);
	gscr->NewFunction("clock", &FParser::SF_Clock);
	gscr->NewFunction("wait", &FParser::SF_Wait);
	gscr->NewFunction("tagwait", &FParser::SF_TagWait);
	gscr->NewFunction("scriptwait", &FParser::SF_ScriptWait);
	gscr->NewFunction("startscript", &FParser::SF_StartScript);
	gscr->NewFunction("scriptrunning", &FParser::SF_ScriptRunning);
	
	// doom stuff
	gscr->NewFunction("startskill", &FParser::SF_StartSkill);
	gscr->NewFunction("exitlevel", &FParser::SF_ExitLevel);
	gscr->NewFunction("tip", &FParser::SF_Tip);
	gscr->NewFunction("timedtip", &FParser::SF_TimedTip);
	gscr->NewFunction("message", &FParser::SF_Message);
	gscr->NewFunction("gameskill", &FParser::SF_Gameskill);
	gscr->NewFunction("gamemode", &FParser::SF_Gamemode);
	
	// player stuff
	gscr->NewFunction("playermsg", &FParser::SF_PlayerMsg);
	gscr->NewFunction("playertip", &FParser::SF_PlayerTip);
	gscr->NewFunction("playeringame", &FParser::SF_PlayerInGame);
	gscr->NewFunction("playername", &FParser::SF_PlayerName);
	gscr->NewFunction("playeraddfrag", &FParser::SF_PlayerAddFrag);
	gscr->NewFunction("playerobj", &FParser::SF_PlayerObj);
	gscr->NewFunction("isplayerobj", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("isobjplayer", &FParser::SF_IsPlayerObj);
	gscr->NewFunction("skincolor", &FParser::SF_SkinColor);
	gscr->NewFunction("playerkeys", &FParser::SF_PlayerKeys);
	gscr->NewFunction("playerammo", &FParser::SF_PlayerAmmo);
	gscr->NewFunction("maxplayerammo", &FParser::SF_MaxPlayerAmmo); 
	gscr->NewFunction("playerweapon", &FParser::SF_PlayerWeapon);
	gscr->NewFunction("playerselwep", &FParser::SF_PlayerSelectedWeapon);
	
	// mobj stuff
	gscr->NewFunction("spawn", &FParser::SF_Spawn);
	gscr->NewFunction("spawnexplosion", &FParser::SF_SpawnExplosion);
	gscr->NewFunction("radiusattack", &FParser::SF_RadiusAttack);
	gscr->NewFunction("kill", &FParser::SF_KillObj);
	gscr->NewFunction("removeobj", &FParser::SF_RemoveObj);
	gscr->NewFunction("objx", &FParser::SF_ObjX);
	gscr->NewFunction("objy", &FParser::SF_ObjY);
	gscr->NewFunction("objz", &FParser::SF_ObjZ);
	gscr->NewFunction("testlocation", &FParser::SF_TestLocation);
	gscr->NewFunction("teleport", &FParser::SF_Teleport);
	gscr->NewFunction("silentteleport", &FParser::SF_SilentTeleport);
	gscr->NewFunction("damageobj", &FParser::SF_DamageObj);
	gscr->NewFunction("healobj", &FParser::SF_HealObj);
	gscr->NewFunction("player", &FParser::SF_Player);
	gscr->NewFunction("objsector", &FParser::SF_ObjSector);
	gscr->NewFunction("objflag", &FParser::SF_ObjFlag);
	gscr->NewFunction("pushobj", &FParser::SF_PushThing);
	gscr->NewFunction("pushthing", &FParser::SF_PushThing);
	gscr->NewFunction("objangle", &FParser::SF_ObjAngle);
	gscr->NewFunction("objhealth", &FParser::SF_ObjHealth);
	gscr->NewFunction("objdead", &FParser::SF_ObjDead);
	gscr->NewFunction("reactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objreactiontime", &FParser::SF_ReactionTime);
	gscr->NewFunction("objtarget", &FParser::SF_MobjTarget);
	gscr->NewFunction("objmomx", &FParser::SF_MobjMomx);
	gscr->NewFunction("objmomy", &FParser::SF_MobjMomy);
	gscr->NewFunction("objmomz", &FParser::SF_MobjMomz);

	gscr->NewFunction("spawnmissile", &FParser::SF_SpawnMissile);
	gscr->NewFunction("mapthings", &FParser::SF_MapThings);
	gscr->NewFunction("objtype", &FParser::SF_ObjType);
	gscr->NewFunction("mapthingnumexist", &FParser::SF_MapThingNumExist);
	gscr->NewFunction("objstate", &FParser::SF_ObjState);
	gscr->NewFunction("resurrect", &FParser::SF_Resurrect);
	gscr->NewFunction("lineattack", &FParser::SF_LineAttack);
	gscr->NewFunction("setobjposition", &FParser::SF_SetObjPosition);

	// sector stuff
	gscr->NewFunction("floorheight", &FParser::SF_FloorHeight);
	gscr->NewFunction("floortext", &FParser::SF_FloorTexture);
	gscr->NewFunction("floortexture", &FParser::SF_FloorTexture);   // haleyjd: alias
	gscr->NewFunction("movefloor", &FParser::SF_MoveFloor);
	gscr->NewFunction("ceilheight", &FParser::SF_CeilingHeight);
	gscr->NewFunction("ceilingheight", &FParser::SF_CeilingHeight); // haleyjd: alias
	gscr->NewFunction("moveceil", &FParser::SF_MoveCeiling);
	gscr->NewFunction("moveceiling", &FParser::SF_MoveCeiling);     // haleyjd: aliases
	gscr->NewFunction("ceilingtexture", &FParser::SF_CeilingTexture);
	gscr->NewFunction("ceiltext", &FParser::SF_CeilingTexture);  // haleyjd: wrong
	gscr->NewFunction("lightlevel", &FParser::SF_LightLevel);    // handler - was
	gscr->NewFunction("fadelight", &FParser::SF_FadeLight);      // &FParser::SF_FloorTexture!
	gscr->NewFunction("colormap", &FParser::SF_SectorColormap);
	
	// cameras!
	gscr->NewFunction("setcamera", &FParser::SF_SetCamera);
	gscr->NewFunction("clearcamera", &FParser::SF_ClearCamera);
	gscr->NewFunction("movecamera", &FParser::SF_MoveCamera);
	
	// trig functions
	gscr->NewFunction("pointtoangle", &FParser::SF_PointToAngle);
	gscr->NewFunction("pointtodist", &FParser::SF_PointToDist);
	
	// sound functions
	gscr->NewFunction("startsound", &FParser::SF_StartSound);
	gscr->NewFunction("startsectorsound", &FParser::SF_StartSectorSound);
	gscr->NewFunction("ambientsound", &FParser::SF_AmbientSound);
	gscr->NewFunction("startambiantsound", &FParser::SF_AmbientSound);	// Legacy's incorrectly spelled name!
	gscr->NewFunction("changemusic", &FParser::SF_ChangeMusic);
	
	// hubs!
	gscr->NewFunction("changehublevel", &FParser::SF_ChangeHubLevel);
	
	// doors
	gscr->NewFunction("opendoor", &FParser::SF_OpenDoor);
	gscr->NewFunction("closedoor", &FParser::SF_CloseDoor);

	// HU Graphics
	gscr->NewFunction("newhupic", &FParser::SF_NewHUPic);
	gscr->NewFunction("createpic", &FParser::SF_NewHUPic);
	gscr->NewFunction("deletehupic", &FParser::SF_DeleteHUPic);
	gscr->NewFunction("modifyhupic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("modifypic", &FParser::SF_ModifyHUPic);
	gscr->NewFunction("sethupicdisplay", &FParser::SF_SetHUPicDisplay);
	gscr->NewFunction("setpicvisible", &FParser::SF_SetHUPicDisplay);

	//
	gscr->NewFunction("playdemo", &FParser::SF_PlayDemo);
	gscr->NewFunction("runcommand", &FParser::SF_RunCommand);
	gscr->NewFunction("checkcvar", &FParser::SF_CheckCVar);
	gscr->NewFunction("setlinetexture", &FParser::SF_SetLineTexture);
	gscr->NewFunction("linetrigger", &FParser::SF_LineTrigger);
	gscr->NewFunction("lineflag", &FParser::SF_LineFlag);

	//Hurdler: new math functions
	gscr->NewFunction("max", &FParser::SF_Max);
	gscr->NewFunction("min", &FParser::SF_Min);
	gscr->NewFunction("abs", &FParser::SF_Abs);

	gscr->NewFunction("sin", &FParser::SF_Sin);
	gscr->NewFunction("asin", &FParser::SF_ASin);
	gscr->NewFunction("cos", &FParser::SF_Cos);
	gscr->NewFunction("acos", &FParser::SF_ACos);
	gscr->NewFunction("tan", &FParser::SF_Tan);
	gscr->NewFunction("atan", &FParser::SF_ATan);
	gscr->NewFunction("exp", &FParser::SF_Exp);
	gscr->NewFunction("log", &FParser::SF_Log);
	gscr->NewFunction("sqrt", &FParser::SF_Sqrt);
	gscr->NewFunction("floor", &FParser::SF_Floor);
	gscr->NewFunction("pow", &FParser::SF_Pow);
	
	// Eternity extensions
	gscr->NewFunction("setlineblocking", &FParser::SF_SetLineBlocking);
	gscr->NewFunction("setlinetrigger", &FParser::SF_SetLineTrigger);
	gscr->NewFunction("setlinemnblock", &FParser::SF_SetLineMonsterBlocking);
	gscr->NewFunction("scriptwaitpre", &FParser::SF_ScriptWaitPre);
	gscr->NewFunction("exitsecret", &FParser::SF_ExitSecret);
	gscr->NewFunction("objawaken", &FParser::SF_ObjAwaken);
	
	// forced coercion functions
	gscr->NewFunction("mobjvalue", &FParser::SF_MobjValue);
	gscr->NewFunction("stringvalue", &FParser::SF_StringValue);
	gscr->NewFunction("intvalue", &FParser::SF_IntValue);
	gscr->NewFunction("fixedvalue", &FParser::SF_FixedValue);

	// new for GZDoom
	gscr->NewFunction("spawnshot2", &FParser::SF_SpawnShot2);
	gscr->NewFunction("setcolor", &FParser::SF_SetColor);
	gscr->NewFunction("objradius", &FParser::SF_MobjRadius);
	gscr->NewFunction("objheight", &FParser::SF_MobjHeight);
	gscr->NewFunction("thingcount", &FParser::SF_ThingCount);
	gscr->NewFunction("killinsector", &FParser::SF_KillInSector);
	gscr->NewFunction("levelnum", &FParser::SF_LevelNum);

	// new inventory
	gscr->NewFunction("giveinventory", &FParser::SF_GiveInventory);
	gscr->NewFunction("takeinventory", &FParser::SF_TakeInventory);
	gscr->NewFunction("checkinventory", &FParser::SF_CheckInventory);
	gscr->NewFunction("setweapon", &FParser::SF_SetWeapon);

	// Dummies - shut up warnings
	gscr->NewFunction("setcorona", &FParser::SF_SetCorona);
}